

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_update_teleport_tree_connections.hpp
# Opt level: O3

void __thiscall
PatchUpdateTeleportTreeConnections::inject_code
          (PatchUpdateTeleportTreeConnections *this,ROM *rom,World *world)

{
  undefined2 uVar1;
  long lVar2;
  _Base_ptr p_Var3;
  pointer __dest;
  LandstalkerException *this_00;
  pair<WorldTeleportTree_*,_WorldTeleportTree_*> *pair;
  _Base_ptr p_Var4;
  size_t __n;
  ByteArray bytes;
  void *local_98;
  long lStack_90;
  long local_88;
  string local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  ROM *local_40;
  _Base_ptr local_38;
  
  local_98 = (void *)0x0;
  lStack_90 = 0;
  local_88 = 0;
  p_Var4 = world[2]._entity_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = world[2]._entity_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  local_40 = rom;
  if (p_Var4 != local_38) {
    do {
      lVar2 = *(long *)p_Var4;
      p_Var3 = p_Var4->_M_parent;
      uVar1 = *(undefined2 *)(lVar2 + 0x20);
      local_78._M_dataplus._M_p._0_1_ = (char)((ushort)uVar1 >> 8);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,(uchar *)&local_78
                );
      local_78._M_dataplus._M_p._0_1_ = (undefined1)uVar1;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,(uchar *)&local_78
                );
      local_78._M_dataplus._M_p._0_1_ = *(undefined1 *)&p_Var3[2]._M_left;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,(uchar *)&local_78
                );
      local_78._M_dataplus._M_p._0_1_ = *(undefined1 *)((long)&p_Var3[2]._M_left + 2);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,(uchar *)&local_78
                );
      uVar1 = (undefined2)p_Var3[1]._M_color;
      local_78._M_dataplus._M_p._0_1_ = (undefined1)((ushort)uVar1 >> 8);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,(uchar *)&local_78
                );
      local_78._M_dataplus._M_p._0_1_ = (undefined1)uVar1;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,(uchar *)&local_78
                );
      local_78._M_dataplus._M_p._0_1_ = *(undefined1 *)(lVar2 + 0x50);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,(uchar *)&local_78
                );
      local_78._M_dataplus._M_p._0_1_ = *(undefined1 *)(lVar2 + 0x52);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,(uchar *)&local_78
                );
      p_Var4 = (_Base_ptr)&p_Var4->_M_left;
    } while (p_Var4 != local_38);
  }
  local_78._M_dataplus._M_p._0_1_ = 0xff;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,(uchar *)&local_78);
  local_78._M_dataplus._M_p._0_1_ = 0xff;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,(uchar *)&local_78);
  if (lStack_90 - (long)local_98 == 0x2a) {
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __dest = (pointer)operator_new(0x2a);
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = __dest + 0x2a;
    __n = lStack_90 - (long)local_98;
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = __dest;
    if (__n != 0) {
      memmove(__dest,local_98,__n);
    }
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = __dest + __n;
    md::ROM::set_bytes(local_40,0x5102,&local_58);
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_98 != (void *)0x0) {
      operator_delete(local_98,local_88 - (long)local_98);
    }
    return;
  }
  this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"Teleport tree flags array has a different size from vanilla game."
             ,"");
  LandstalkerException::LandstalkerException(this_00,&local_78);
  __cxa_throw(this_00,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException);
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        constexpr uint32_t TELEPORT_TREE_FLAGS_TABLE_ADDR = 0x5102;
        ByteArray bytes;

        RandomizerWorld& randomizer_world = reinterpret_cast<RandomizerWorld&>(world);
        for(const auto& pair : randomizer_world.teleport_tree_pairs())
        {
            WorldTeleportTree* tree_1 = pair.first;
            WorldTeleportTree* tree_2 = pair.second;

            bytes.add_word(tree_1->map_id());
            bytes.add_byte((uint8_t)tree_2->flag().byte);
            bytes.add_byte(tree_2->flag().bit);

            bytes.add_word(tree_2->map_id());
            bytes.add_byte((uint8_t)tree_1->flag().byte);
            bytes.add_byte(tree_1->flag().bit);
        }
        bytes.add_word(0xFFFF);

        if(bytes.size() != 0x2A)
            throw LandstalkerException("Teleport tree flags array has a different size from vanilla game.");
        rom.set_bytes(TELEPORT_TREE_FLAGS_TABLE_ADDR, bytes);
    }